

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::Error(string *m)

{
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmMessageMetadata local_18;
  
  std::operator+(&local_38,"CMake Error: ",m);
  s_ErrorOccurred = true;
  local_18.desiredColor = 0;
  local_18.title = "Error";
  Message(&local_38,&local_18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::Error(const std::string& m)
{
  std::string message = "CMake Error: " + m;
  cmSystemTools::s_ErrorOccurred = true;
  cmSystemTools::Message(message, "Error");
}